

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O1

bool __thiscall
Potassco::AspifTextOutput::assignAtomName(AspifTextOutput *this,Atom_t atom,string *str)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  Data *pDVar4;
  StringMapNode node;
  size_t __n;
  pointer pcVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
  _Var9;
  byte bVar10;
  __hashtable *__h;
  ulong uVar11;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>,_bool>
  pVar12;
  value_type local_58 [4];
  Atom_t local_38;
  
  if (this->maxAtom_ < atom) {
    bVar1 = *(str->_M_dataplus)._M_p;
    uVar11 = (ulong)atom;
    pDVar4 = this->data_;
    if ((ulong)((long)(pDVar4->atoms).
                      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pDVar4->atoms).
                      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar11) {
      local_58[0] = (value_type)0x0;
      std::
      vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
      ::resize(&pDVar4->atoms,(ulong)(atom + 1),local_58);
    }
    pDVar4 = this->data_;
    node = (pDVar4->atoms).
           super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar11];
    bVar10 = bVar1;
    if (node == (StringMapNode)0x0) {
LAB_0010aeb1:
      bVar6 = true;
    }
    else if (((node->second == atom) &&
             (__n = (node->first)._M_string_length, __n == str->_M_string_length)) &&
            ((bVar10 = 1, __n == 0 ||
             (iVar7 = bcmp((node->first)._M_dataplus._M_p,(str->_M_dataplus)._M_p,__n), iVar7 == 0))
            )) {
      bVar6 = false;
    }
    else {
      Data::convertToOutput(pDVar4,node);
      if (bVar1 == 0x26) goto LAB_0010aeb1;
      bVar6 = false;
      bVar10 = 0;
    }
    if (!bVar6) goto LAB_0010afa7;
    if (((2 < str->_M_string_length) && (pcVar8 = (str->_M_dataplus)._M_p, *pcVar8 == 'x')) &&
       (pcVar8[1] == '_')) {
      pcVar8 = pcVar8 + 2;
      do {
        cVar2 = *pcVar8;
        pcVar8 = pcVar8 + 1;
      } while ((byte)(cVar2 - 0x30U) < 10);
      if (cVar2 == '\0') {
        Data::setGenName(this->data_,atom);
        bVar10 = 0;
        goto LAB_0010afa7;
      }
    }
    pDVar4 = this->data_;
    pcVar5 = (str->_M_dataplus)._M_p;
    local_58[0] = (value_type)(local_58 + 2);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,pcVar5,pcVar5 + str->_M_string_length);
    local_38 = atom;
    pVar12 = std::
             _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
             ::_M_emplace<std::pair<std::__cxx11::string_const,unsigned_int>>
                       ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                         *)&pDVar4->strings,(string *)local_58);
    _Var9 = pVar12.first.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
            ._M_cur;
    if (local_58[0] != (value_type)(local_58 + 2)) {
      operator_delete(local_58[0]);
    }
    uVar3 = *(uint *)((long)_Var9.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                            ._M_cur + 0x28);
    if (uVar3 == atom || uVar3 == 0xffffffff) {
      *(Atom_t *)
       ((long)_Var9.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
              ._M_cur + 0x28) = atom;
      (this->data_->atoms).
      super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar11] =
           (StringMapNode)
           ((long)_Var9.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                  ._M_cur + 8);
      bVar10 = 1;
      goto LAB_0010afa7;
    }
    if (this->maxAtom_ < uVar3) {
      Data::convertToOutput
                (this->data_,
                 (StringMapNode)
                 ((long)_Var9.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                        ._M_cur + 8));
    }
    Data::setGenName(this->data_,atom);
  }
  bVar10 = 0;
LAB_0010afa7:
  return (bool)(bVar10 & 1);
}

Assistant:

bool AspifTextOutput::assignAtomName(Atom_t atom, const std::string& str) {
	if (atom <= maxAtom_) {
		return false;
	}
	assert(!str.empty());
	bool theory = str[0] == '&';
	if (atom >= data_->atoms.size()) { data_->atoms.resize(atom + 1, 0); }
	if (Data::StringMapNode node = data_->atoms[atom]) { // atom already has a tentative name
		if (node->second == atom && node->first == str) {
			return true; // identical name, ignore duplicate
		}
		data_->convertToOutput(node); // drop assignment
		if (!theory) {
			return false;
		}
	}
	if (str.size() > 2 && str[0] == 'x' && str[1] == '_') {
		const char* x = str.c_str() + 2;
		while (BufferedStream::isDigit(*x)) { ++x; }
		if (!*x) {
			data_->setGenName(atom);
			return false;
		}
	}
	Data::StringMapNode node = &*data_->strings.insert(Data::StringMapVal(str, atom)).first;
	if (node->second == atom || node->second == idMax) { // assign tentative name to atom
		node->second       = atom;
		data_->atoms[atom] = node;
		return true;
	}
	// name already used: drop previous (tentative) assigment and prevent further assignments
	if (node->second > maxAtom_) {
		data_->convertToOutput(node);
	}
	data_->setGenName(atom);
	return false;
}